

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O1

HighsStatus
analyseSetCreateError
          (HighsLogOptions *log_options,string *method,HighsInt create_error,bool ordered,
          HighsInt num_set_entries,HighsInt *set,HighsInt dimension)

{
  HighsStatus extraout_EAX;
  HighsStatus extraout_EAX_00;
  char *format;
  undefined4 in_register_00000084;
  
  if (create_error == 3) {
    if (ordered) {
      format = "Set supplied to Highs::%s contains duplicate entries\n";
    }
    else {
      format = "Set supplied to Highs::%s not ordered\n";
    }
    highsLogUser(log_options,kError,format,(method->_M_dataplus)._M_p,
                 CONCAT44(in_register_00000084,num_set_entries));
    return extraout_EAX_00;
  }
  if (create_error == 1) {
    highsLogUser(log_options,kError,"Set supplied to Highs::%s has illegal size of %d\n",
                 (method->_M_dataplus)._M_p,CONCAT44(in_register_00000084,num_set_entries));
    return extraout_EAX;
  }
  if (-1 < create_error) {
    return create_error;
  }
  highsLogUser(log_options,kError,
               "Set supplied to Highs::%s has entry %d of %d out of range [0, %d)\n",
               (method->_M_dataplus)._M_p,(ulong)(uint)~create_error,
               (ulong)(uint)set[(uint)~create_error]);
  return dimension;
}

Assistant:

static HighsStatus analyseSetCreateError(HighsLogOptions log_options,
                                         const std::string method,
                                         const HighsInt create_error,
                                         const bool ordered,
                                         const HighsInt num_set_entries,
                                         const HighsInt* set,
                                         const HighsInt dimension) {
  if (create_error == kIndexCollectionCreateIllegalSetSize) {
    highsLogUser(log_options, HighsLogType::kError,
                 "Set supplied to Highs::%s has illegal size of %d\n",
                 method.c_str(), int(num_set_entries));
  } else if (create_error == kIndexCollectionCreateIllegalSetOrder) {
    if (ordered) {
      // Creating an index_collection data structure for the set
      // includes a test that the indices increase strictly. If this
      // is not the case then, since an increasing set was created
      // locally, it must contain duplicate entries. return with an
      // error
      highsLogUser(log_options, HighsLogType::kError,
                   "Set supplied to Highs::%s contains duplicate entries\n",
                   method.c_str());
    } else {
      highsLogUser(log_options, HighsLogType::kError,
                   "Set supplied to Highs::%s not ordered\n", method.c_str());
    }
  } else if (create_error < 0) {
    HighsInt illegal_set_index = -1 - create_error;
    HighsInt illegal_set_entry = set[illegal_set_index];
    highsLogUser(
        log_options, HighsLogType::kError,
        "Set supplied to Highs::%s has entry %d of %d out of range [0, %d)\n",
        method.c_str(), int(illegal_set_index), int(illegal_set_entry),
        int(dimension));
  }
  assert(create_error != kIndexCollectionCreateIllegalSetDimension);
  return HighsStatus::kError;
}